

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.h
# Opt level: O2

void __thiscall HEkkDualRow::~HEkkDualRow(HEkkDualRow *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->alt_workGroup).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&(this->sorted_workData).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&(this->original_workData).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->workGroup).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&(this->workData).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->packValue).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->packIndex).super__Vector_base<int,_std::allocator<int>_>);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->freeList)._M_t);
  return;
}

Assistant:

HEkkDualRow(HEkk& simplex) : ekk_instance_(simplex) {}